

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3399e2::mock_file_system_traits::mock_file_system_traits
          (mock_file_system_traits *this)

{
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this);
  (this->gmock01_exists_32).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00276168;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->gmock01_unlink_33).super_UntypedFunctionMockerBase);
  (this->gmock01_unlink_33).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00276268;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->gmock02_rename_34).super_UntypedFunctionMockerBase);
  (this->gmock02_rename_34).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002762d0;
  return;
}

Assistant:

mock_file_system_traits () {}